

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O1

plain_iterator * __thiscall
dg::vr::ValueRelations::begin(plain_iterator *__return_storage_ptr__,ValueRelations *this)

{
  _Base_ptr p_Var1;
  
  p_Var1 = (this->bucketToVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  (__return_storage_ptr__->bucketIt)._M_node = p_Var1;
  (__return_storage_ptr__->endIt)._M_node =
       &(this->bucketToVals)._M_t._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->valueIt)._M_current = (Value **)p_Var1[1]._M_parent;
  PlainValueIterator::nextViableValue(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ValueRelations::plain_iterator ValueRelations::begin() const {
    return {bucketToVals.begin(), bucketToVals.end()};
}